

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

VectorXd Util::StdVec2Eigen(vector<double,_std::allocator<double>_> *vec1)

{
  size_type sVar1;
  reference pvVar2;
  Index extraout_RDX;
  Index IVar3;
  Index extraout_RDX_00;
  vector<double,_std::allocator<double>_> *in_RSI;
  Matrix<double,__1,_1,_0,__1,_1> *in_RDI;
  VectorXd VVar4;
  int ii;
  int n;
  VectorXd *vec2;
  value_type index;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_ffffffffffffffb0;
  undefined4 local_1c;
  
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(in_RDI,(int *)in_RSI);
  IVar3 = extraout_RDX;
  for (local_1c = 0; local_1c < (int)sVar1; local_1c = local_1c + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_1c);
    index = *pvVar2;
    in_stack_ffffffffffffffb0 =
         (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                   (in_stack_ffffffffffffffb0,(Index)index);
    *(value_type *)in_stack_ffffffffffffffb0 = index;
    IVar3 = extraout_RDX_00;
  }
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar3;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)in_RDI;
  return (VectorXd)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd StdVec2Eigen(std::vector<double> vec1){

		//locals
		int n = vec1.size();
		Eigen::VectorXd vec2(n);

		//loop
		for (int ii = 0; ii < n; ++ii){
			vec2[ii] = vec1[ii];
		}

		//output
		return vec2;

	}